

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_maddr_q(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2,TCGv_i32 r3,
                uint32_t n)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 arg5;
  TCGv_i32 temp;
  TCGContext_conflict9 *tcg_ctx;
  uint32_t n_local;
  TCGv_i32 r3_local;
  TCGv_i32 r2_local;
  TCGv_i32 r1_local;
  TCGv_i32 ret_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  arg5 = tcg_const_i32_tricore(tcg_ctx_00,n);
  gen_helper_maddr_q(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,r1,r2,r3,arg5);
  tcg_temp_free_i32(tcg_ctx_00,arg5);
  return;
}

Assistant:

static inline void
gen_maddr_q(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2, TCGv r3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_const_i32(tcg_ctx, n);
    gen_helper_maddr_q(tcg_ctx, ret, tcg_ctx->cpu_env, r1, r2, r3, temp);
    tcg_temp_free(tcg_ctx, temp);
}